

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
LinkLanguageNode::Evaluate
          (string *__return_storage_ptr__,LinkLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  GeneratorExpressionContent *pGVar1;
  cmGeneratorExpressionContext *this_00;
  bool bVar2;
  __type _Var3;
  long lVar4;
  allocator<char> local_16a;
  allocator<char> local_169;
  reference local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_140;
  string local_120;
  string local_100 [8];
  string genName;
  cmGlobalGenerator *gg;
  string local_d0;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  string local_58;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  LinkLanguageNode *this_local;
  
  local_38 = dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (LinkLanguageNode *)__return_storage_ptr__;
  if (((context->HeadTarget == (cmGeneratorTarget *)0x0) ||
      (dagChecker == (cmGeneratorExpressionDAGChecker *)0x0)) ||
     ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression(dagChecker), !bVar2 &&
      (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                         (local_38,(cmGeneratorTarget *)0x0,ANY), !bVar2)))) {
    pGVar1 = content_local;
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_58,(GeneratorExpressionContent *)dagChecker_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "$<LINK_LANGUAGE:...> may only be used with binary targets to specify link libraries, link directories, link options and link depends."
               ,&local_79);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                      (local_38,(cmGeneratorTarget *)0x0,ANY);
    if ((bVar2) &&
       (bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)context_local), pGVar1 = content_local, bVar2)) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_b0,(GeneratorExpressionContent *)dagChecker_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 "$<LINK_LANGUAGE> is not supported in link libraries expression.",
                 (allocator<char> *)((long)&gg + 7));
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gg + 7));
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      genName.field_2._8_8_ =
           cmLocalGenerator::GetGlobalGenerator
                     ((cmLocalGenerator *)
                      content_local[3].ParamChildren.
                      super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      (*((cmGlobalGenerator *)genName.field_2._8_8_)->_vptr_cmGlobalGenerator[3])(local_100);
      lVar4 = std::__cxx11::string::find((char *)local_100,0xc48918);
      if ((((lVar4 == -1) &&
           (lVar4 = std::__cxx11::string::find((char *)local_100,0xc1cc5d), lVar4 == -1)) &&
          (lVar4 = std::__cxx11::string::find((char *)local_100,0xc18879), lVar4 == -1)) &&
         ((lVar4 = std::__cxx11::string::find((char *)local_100,0xc1987f), lVar4 == -1 &&
          (lVar4 = std::__cxx11::string::find((char *)local_100,0xc1cc76), pGVar1 = content_local,
          lVar4 == -1)))) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_120,(GeneratorExpressionContent *)dagChecker_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"$<LINK_LANGUAGE:...> not supported for this generator.",
                   (allocator<char> *)((long)&__range1 + 7));
        reportError((cmGeneratorExpressionContext *)pGVar1,&local_120,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                          (local_38,(cmGeneratorTarget *)0x0,ANY);
        if (bVar2) {
          *(undefined1 *)((long)&content_local[4].StartContent + 3) = 1;
          *(undefined1 *)((long)&content_local[4].StartContent + 4) = 1;
        }
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)context_local);
        this_00 = context_local;
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)&content_local[4].IdentifierChildren
                    );
        }
        else {
          __end1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)context_local);
          param = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_00);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&param), bVar2) {
            local_168 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end1);
            _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&content_local[4].IdentifierChildren,local_168);
            if (_Var3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"1",&local_169);
              std::allocator<char>::~allocator(&local_169);
              goto LAB_008b4d72;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"0",&local_16a);
          std::allocator<char>::~allocator(&local_16a);
        }
      }
LAB_008b4d72:
      __range1._0_4_ = 1;
      std::__cxx11::string::~string(local_100);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (!context->HeadTarget || !dagChecker ||
        !(dagChecker->EvaluatingLinkExpression() ||
          dagChecker->EvaluatingLinkLibraries())) {
      reportError(context, content->GetOriginalExpression(),
                  "$<LINK_LANGUAGE:...> may only be used with binary targets "
                  "to specify link libraries, link directories, link options "
                  "and link depends.");
      return std::string();
    }
    if (dagChecker->EvaluatingLinkLibraries() && parameters.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_LANGUAGE> is not supported in link libraries expression.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos) {
      reportError(context, content->GetOriginalExpression(),
                  "$<LINK_LANGUAGE:...> not supported for this generator.");
      return std::string();
    }

    if (dagChecker->EvaluatingLinkLibraries()) {
      context->HadHeadSensitiveCondition = true;
      context->HadLinkLanguageSensitiveCondition = true;
    }

    if (parameters.empty()) {
      return context->Language;
    }

    for (auto const& param : parameters) {
      if (context->Language == param) {
        return "1";
      }
    }
    return "0";
  }